

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::UninterpretedOption::ByteSize(UninterpretedOption *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Type *value;
  int i;
  int iVar5;
  
  uVar3 = this->_has_bits_[0];
  iVar5 = 0;
  iVar4 = 0;
  if ((uVar3 & 0x1fe) != 0) {
    iVar2 = 0;
    if ((uVar3 & 2) != 0) {
      iVar2 = internal::WireFormatLite::StringSize(this->identifier_value_);
      iVar2 = iVar2 + 1;
      uVar3 = this->_has_bits_[0];
    }
    if ((uVar3 & 4) != 0) {
      iVar4 = io::CodedOutputStream::VarintSize64(this->positive_int_value_);
      iVar2 = iVar2 + iVar4 + 1;
      uVar3 = this->_has_bits_[0];
    }
    if ((uVar3 & 8) != 0) {
      iVar4 = io::CodedOutputStream::VarintSize64(this->negative_int_value_);
      iVar2 = iVar2 + iVar4 + 1;
      uVar3 = this->_has_bits_[0];
    }
    iVar4 = iVar2 + 9;
    if ((uVar3 & 0x10) == 0) {
      iVar4 = iVar2;
    }
    if ((uVar3 & 0x20) != 0) {
      iVar2 = internal::WireFormatLite::BytesSize(this->string_value_);
      iVar4 = iVar4 + iVar2 + 1;
      uVar3 = this->_has_bits_[0];
    }
    if ((uVar3 & 0x40) != 0) {
      iVar2 = internal::WireFormatLite::StringSize(this->aggregate_value_);
      iVar4 = iVar4 + iVar2 + 1;
    }
  }
  iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar2;
  for (; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                      (&(this->name_).super_RepeatedPtrFieldBase,iVar5);
    iVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::UninterpretedOption_NamePart>(value);
    iVar4 = iVar4 + iVar2;
    iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar5 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int UninterpretedOption::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  total_size += 1 * this->name_size();
  for (int i = 0; i < this->name_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->name(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}